

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::BitTrie::insert<slang::PoolAllocator<slang::ast::BitTrie,72ul,8ul>>
          (BitTrie *this,UdpEntrySyntax *syntax,span<const_char,_18446744073709551615UL> inputs,
          char stateChar,PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *allocator,
          SmallVector<const_slang::syntax::UdpEntrySyntax_*,_5UL> *results)

{
  pointer ppBVar1;
  SmallVector<slang::ast::BitTrie_*,_5UL> *nodes_00;
  long lVar2;
  long lVar3;
  anon_class_16_2_af07dd90 handle;
  SmallVector<slang::ast::BitTrie_*,_5UL> nodes;
  BitTrie *local_90;
  anon_class_16_2_af07dd90 local_88;
  BitTrie *local_78;
  SmallVector<slang::ast::BitTrie_*,_5UL> local_70;
  
  local_88.primaryNode = &local_90;
  local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.data_ =
       (pointer)local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.firstElement;
  local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.len = 0;
  local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.cap = 5;
  local_90 = this;
  local_88.allocator = allocator;
  local_78 = this;
  SmallVectorBase<slang::ast::BitTrie*>::emplace_back<slang::ast::BitTrie*>
            ((SmallVectorBase<slang::ast::BitTrie*> *)&local_70,&local_78);
  nodes_00 = &local_70;
  traverse<slang::ast::BitTrie,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_MemberSymbols_cpp:792:23)_&>
            (this,nodes_00,inputs,stateChar,&local_88);
  ppBVar1 = local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.data_;
  lVar2 = local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.len << 3;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 8) {
    nodes_00 = *(SmallVector<slang::ast::BitTrie_*,_5UL> **)((long)ppBVar1 + lVar3);
    if (nodes_00[1].super_SmallVectorBase<slang::ast::BitTrie_*>.data_ != (pointer)0x0) {
      nodes_00 = nodes_00 + 1;
      SmallVectorBase<slang::syntax::UdpEntrySyntax_const*>::
      emplace_back<slang::syntax::UdpEntrySyntax_const*const&>
                ((SmallVectorBase<slang::syntax::UdpEntrySyntax_const*> *)results,
                 (UdpEntrySyntax **)nodes_00);
    }
  }
  local_90->entry = syntax;
  SmallVectorBase<slang::ast::BitTrie_*>::cleanup
            (&local_70.super_SmallVectorBase<slang::ast::BitTrie_*>,(EVP_PKEY_CTX *)nodes_00);
  return;
}

Assistant:

void insert(const UdpEntrySyntax& syntax, std::span<const char> inputs, char stateChar,
                TAllocator& allocator, SmallVector<const UdpEntrySyntax*>& results) {
        BitTrie* primaryNode = this;
        auto handle = [&primaryNode, &allocator](const BitTrie& constNode,
                                                 SmallVector<BitTrie*>& nextNodes, int index,
                                                 bool primary) {
            // If we are handling a primary and the current node is also
            // the primary node we should allocate if missing, otherwise
            // we only add if it already exists.
            BitTrie& node = const_cast<BitTrie&>(constNode);
            if (primary && primaryNode == &node) {
                if (!node.children[index])
                    node.children[index] = allocator.emplace();
                primaryNode = node.children[index];
            }

            if (node.children[index])
                nextNodes.push_back(node.children[index]);
        };

        SmallVector<BitTrie*> nodes;
        nodes.push_back(this);
        traverse(nodes, inputs, stateChar, handle);

        for (auto node : nodes) {
            if (node->entry)
                results.push_back(node->entry);
        }

        // Store the provided row so as not to miss info in case of possible overlap.
        // If the primary->entry already has a value, then rewriting will not spoil
        // anything, since the rewriting will be to the equivalent grammar.
        primaryNode->entry = &syntax;
    }